

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

Bool ParseTabs(TidyDocImpl *doc,TidyOptionImpl *entry)

{
  uint uVar1;
  uint in_EAX;
  Bool BVar2;
  ulong uStack_28;
  uint flag;
  
  uStack_28 = (ulong)in_EAX;
  BVar2 = GetParsePickListValue(doc,entry,&flag);
  if (BVar2 != no) {
    uVar1 = flag;
    prvTidySetOptionBool(doc,entry->id,(uint)(flag != 0));
    if (uVar1 != 0) {
      prvTidySetOptionInt(doc,TidyIndentSpaces,1);
    }
  }
  return BVar2;
}

Assistant:

Bool ParseTabs( TidyDocImpl* doc, const TidyOptionImpl* entry )
{
    uint flag = 0;
    Bool status = GetParsePickListValue( doc, entry, &flag );
    
    if ( status ) {
        Bool tabs = flag != 0 ? yes : no;
        TY_(SetOptionBool)( doc, entry->id, tabs );
        if (tabs) {
            TY_(SetOptionInt)( doc, TidyIndentSpaces, 1 );
        } else {
            /* optional - TY_(ResetOptionToDefault)( doc, TidyIndentSpaces ); */
        }
    }
    return status;
}